

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void fielddesc_setfloat_var(_fielddesc *fd,t_symbol *s)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  t_symbol *ptVar3;
  char *pcVar4;
  double quantum;
  double screen2;
  double screen1;
  double v2;
  double v1;
  char strbuf [1000];
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  double local_420;
  char local_418 [1000];
  
  fd->fd_type = '\x01';
  fd->fd_var = '\x01';
  pcVar4 = s->s_name;
  pcVar2 = strchr(pcVar4,0x28);
  if ((pcVar2 == (char *)0x0) || (__s = strchr(pcVar4,0x29), __s < pcVar2)) {
    (fd->fd_un).fd_symbol = s;
    fd->fd_v1 = 0.0;
    fd->fd_v2 = 0.0;
    fd->fd_screen1 = 0.0;
    fd->fd_screen2 = 0.0;
  }
  else {
    iVar1 = (int)pcVar2 - (int)pcVar4;
    if (0x3e2 < iVar1) {
      iVar1 = 0x3e3;
    }
    strncpy(local_418,pcVar4,(long)iVar1);
    local_418[iVar1] = '\0';
    ptVar3 = gensym(local_418);
    (fd->fd_un).fd_symbol = ptVar3;
    iVar1 = __isoc99_sscanf(pcVar2,"(%lf:%lf)(%lf:%lf)(%lf)",&local_420,&local_428,&local_430,
                            &local_438,&local_440);
    fd->fd_v1 = (float)local_420;
    fd->fd_v2 = (float)local_428;
    fd->fd_screen1 = (float)local_430;
    fd->fd_screen2 = (float)local_438;
    fd->fd_quantum = (float)local_440;
    if (((iVar1 == 3 || iVar1 < 2) ||
        ((iVar1 < 4 && (pcVar4 = strchr(__s,0x28), pcVar4 != (char *)0x0)))) ||
       ((iVar1 < 5 &&
        ((pcVar4 = strchr(__s,0x28), pcVar4 != (char *)0x0 &&
         (pcVar4 = strchr(pcVar4 + 1,0x28), pcVar4 != (char *)0x0)))))) {
      post("parse error: %s",s->s_name);
      fd->fd_v1 = 0.0;
      fd->fd_v2 = 0.0;
      fd->fd_screen1 = 0.0;
      fd->fd_screen2 = 0.0;
      fd->fd_quantum = 0.0;
      return;
    }
    if (iVar1 == 2) {
      fd->fd_quantum = 0.0;
      fd->fd_screen1 = (float)local_420;
      fd->fd_screen2 = (float)local_428;
      return;
    }
    if (iVar1 != 4) {
      return;
    }
  }
  fd->fd_quantum = 0.0;
  return;
}

Assistant:

static void fielddesc_setfloat_var(t_fielddesc *fd, t_symbol *s)
{
    char *s1, *s2, *s3, strbuf[MAXPDSTRING];
    int i;
    fd->fd_type = A_FLOAT;
    fd->fd_var = 1;
    if (!(s1 = strchr(s->s_name, '(')) || !(s2 = strchr(s->s_name, ')'))
        || (s1 > s2))
    {
        fd->fd_un.fd_varsym = s;
        fd->fd_v1 = fd->fd_v2 = fd->fd_screen1 = fd->fd_screen2 =
            fd->fd_quantum = 0;
    }
    else
    {
        int cpy = (int)(s1 - s->s_name), got;
        double v1, v2, screen1, screen2, quantum;
        if (cpy > MAXPDSTRING-5)
            cpy = MAXPDSTRING-5;
        strncpy(strbuf, s->s_name, cpy);
        strbuf[cpy] = 0;
        fd->fd_un.fd_varsym = gensym(strbuf);
        got = sscanf(s1, "(%lf:%lf)(%lf:%lf)(%lf)",
            &v1, &v2, &screen1, &screen2,
                &quantum);
        fd->fd_v1=v1;
        fd->fd_v2=v2;
        fd->fd_screen1=screen1;
        fd->fd_screen2=screen2;
        fd->fd_quantum=quantum;
        if (got < 2)
            goto fail;
        if (got == 3 || (got < 4 && strchr(s2, '(')))
            goto fail;
        if (got < 5 && (s3 = strchr(s2, '(')) && strchr(s3+1, '('))
            goto fail;
        if (got == 4)
            fd->fd_quantum = 0;
        else if (got == 2)
        {
            fd->fd_quantum = 0;
            fd->fd_screen1 = fd->fd_v1;
            fd->fd_screen2 = fd->fd_v2;
        }
        return;
    fail:
        post("parse error: %s", s->s_name);
        fd->fd_v1 = fd->fd_screen1 = fd->fd_v2 = fd->fd_screen2 =
            fd->fd_quantum = 0;
    }
}